

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O3

void WebPCleanupTransparentArea(WebPPicture *pic)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint32_t *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint8_t *puVar11;
  int iVar12;
  uint8_t *puVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint32_t uVar17;
  uint8_t *puVar18;
  int iVar19;
  uint8_t *puVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  uint32_t *puVar24;
  byte *y_ptr;
  undefined1 auVar25 [16];
  int width;
  
  if (pic != (WebPPicture *)0x0) {
    iVar3 = pic->width;
    iVar12 = pic->height;
    iVar7 = iVar3 + 7;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    iVar10 = iVar12 + 7;
    if (-1 < iVar12) {
      iVar10 = iVar12;
    }
    if (pic->use_argb == 0) {
      puVar11 = pic->y;
      puVar13 = pic->u;
      puVar20 = pic->v;
      puVar18 = pic->a;
      auVar25._0_4_ = -(uint)((int)((ulong)puVar18 >> 0x20) == 0 && (int)puVar18 == 0);
      auVar25._4_4_ = -(uint)((int)puVar11 == 0 && (int)((ulong)puVar11 >> 0x20) == 0);
      auVar25._8_4_ = -(uint)((int)((ulong)puVar13 >> 0x20) == 0 && (int)puVar13 == 0);
      auVar25._12_4_ = -(uint)(*(int *)&pic->v == 0 && (int)((ulong)puVar20 >> 0x20) == 0);
      iVar7 = movmskps(iVar7,auVar25);
      if (iVar7 == 0) {
        iVar7 = pic->y_stride;
        iVar10 = pic->a_stride;
        if (iVar12 < 8) {
          iVar15 = 0;
        }
        else {
          lVar23 = (long)pic->uv_stride;
          iVar8 = pic->uv_stride * 4;
          bVar2 = 0;
          bVar1 = 0;
          uVar14 = 0;
          iVar19 = 8;
          do {
            iVar15 = iVar19;
            if (iVar3 < 8) {
              uVar21 = 0;
            }
            else {
              bVar5 = true;
              uVar16 = 0;
              uVar6 = 8;
              do {
                uVar21 = uVar6;
                y_ptr = puVar11 + uVar16;
                iVar19 = SmoothenBlock(puVar18 + uVar16,iVar10,y_ptr,iVar7,8,8);
                if (iVar19 == 0) {
                  bVar5 = true;
                }
                else {
                  if (bVar5) {
                    uVar14 = (ulong)*y_ptr;
                    bVar1 = puVar13[uVar16 >> 1];
                    bVar2 = puVar20[uVar16 >> 1];
                  }
                  iVar19 = 8;
                  do {
                    *(ulong *)y_ptr = uVar14 * 0x101010101010101;
                    y_ptr = y_ptr + iVar7;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                  uVar9 = uVar16 >> 1;
                  iVar19 = (uint)bVar1 * 0x1010101;
                  *(int *)(puVar13 + uVar9) = iVar19;
                  *(int *)(puVar13 + lVar23 + uVar9) = iVar19;
                  *(int *)(puVar13 + lVar23 + lVar23 + uVar9) = iVar19;
                  *(int *)(puVar13 + lVar23 * 2 + lVar23 + uVar9) = iVar19;
                  iVar19 = (uint)bVar2 * 0x1010101;
                  *(int *)(puVar20 + uVar9) = iVar19;
                  *(int *)(puVar20 + lVar23 + uVar9) = iVar19;
                  *(int *)(puVar20 + lVar23 + lVar23 + uVar9) = iVar19;
                  *(int *)(puVar20 + lVar23 * 2 + lVar23 + uVar9) = iVar19;
                  bVar5 = false;
                }
                uVar16 = uVar16 + 8;
                uVar6 = uVar21 + 8;
              } while ((int)(uVar21 + 8) <= iVar3);
            }
            if (iVar3 - uVar21 != 0 && (int)uVar21 <= iVar3) {
              SmoothenBlock(puVar18 + uVar21,iVar10,puVar11 + uVar21,iVar7,iVar3 - uVar21,8);
            }
            puVar18 = puVar18 + (long)iVar10 * 8;
            puVar11 = puVar11 + iVar7 * 8;
            puVar13 = puVar13 + iVar8;
            puVar20 = puVar20 + iVar8;
            iVar19 = iVar15 + 8;
          } while (iVar15 + 8 <= iVar12);
        }
        iVar19 = iVar12 - iVar15;
        if (iVar19 != 0 && iVar15 <= iVar12) {
          uVar14 = 0;
          if (7 < iVar3) {
            uVar16 = 0;
            do {
              SmoothenBlock(puVar18 + uVar16,iVar10,puVar11 + uVar16,iVar7,8,iVar19);
              uVar14 = uVar16 + 8;
              iVar12 = (int)uVar16;
              uVar16 = uVar14;
            } while (iVar12 + 0x10 <= iVar3);
          }
          iVar12 = iVar3 - (int)uVar14;
          if (iVar12 != 0 && (int)uVar14 <= iVar3) {
            SmoothenBlock(puVar18 + (uVar14 & 0xffffffff),iVar10,puVar11 + (uVar14 & 0xffffffff),
                          iVar7,iVar12,iVar19);
            return;
          }
        }
      }
    }
    else if (7 < iVar12) {
      iVar12 = 0;
      uVar17 = 0;
      do {
        if (7 < iVar3) {
          puVar4 = pic->argb;
          bVar5 = true;
          iVar19 = 0;
          do {
            iVar8 = pic->argb_stride;
            lVar23 = (long)((iVar8 * iVar12 + iVar19) * 8);
            puVar24 = puVar4 + lVar23;
            iVar15 = 0;
            do {
              lVar22 = 0;
              do {
                if (0xffffff < puVar24[lVar22]) {
                  bVar5 = true;
                  goto LAB_0012c845;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 8);
              iVar15 = iVar15 + 1;
              puVar24 = puVar24 + iVar8;
            } while (iVar15 != 8);
            if (bVar5) {
              uVar17 = puVar4[lVar23];
            }
            puVar24 = puVar4 + lVar23 + 4;
            iVar15 = 8;
            do {
              puVar24[-4] = uVar17;
              puVar24[-3] = uVar17;
              puVar24[-2] = uVar17;
              puVar24[-1] = uVar17;
              *puVar24 = uVar17;
              puVar24[1] = uVar17;
              puVar24[2] = uVar17;
              puVar24[3] = uVar17;
              puVar24 = puVar24 + iVar8;
              bVar5 = false;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
LAB_0012c845:
            iVar19 = iVar19 + 1;
          } while (iVar19 != iVar7 >> 3);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar10 >> 3);
    }
  }
  return;
}

Assistant:

void WebPCleanupTransparentArea(WebPPicture* pic) {
  int x, y, w, h;
  if (pic == NULL) return;
  w = pic->width / SIZE;
  h = pic->height / SIZE;

  // note: we ignore the left-overs on right/bottom, except for SmoothenBlock().
  if (pic->use_argb) {
    uint32_t argb_value = 0;
    for (y = 0; y < h; ++y) {
      int need_reset = 1;
      for (x = 0; x < w; ++x) {
        const int off = (y * pic->argb_stride + x) * SIZE;
        if (IsTransparentARGBArea(pic->argb + off, pic->argb_stride, SIZE)) {
          if (need_reset) {
            argb_value = pic->argb[off];
            need_reset = 0;
          }
          FlattenARGB(pic->argb + off, argb_value, pic->argb_stride, SIZE);
        } else {
          need_reset = 1;
        }
      }
    }
  } else {
    const int width = pic->width;
    const int height = pic->height;
    const int y_stride = pic->y_stride;
    const int uv_stride = pic->uv_stride;
    const int a_stride = pic->a_stride;
    uint8_t* y_ptr = pic->y;
    uint8_t* u_ptr = pic->u;
    uint8_t* v_ptr = pic->v;
    const uint8_t* a_ptr = pic->a;
    int values[3] = { 0 };
    if (a_ptr == NULL || y_ptr == NULL || u_ptr == NULL || v_ptr == NULL) {
      return;
    }
    for (y = 0; y + SIZE <= height; y += SIZE) {
      int need_reset = 1;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        if (SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                          SIZE, SIZE)) {
          if (need_reset) {
            values[0] = y_ptr[x];
            values[1] = u_ptr[x >> 1];
            values[2] = v_ptr[x >> 1];
            need_reset = 0;
          }
          Flatten(y_ptr + x,        values[0], y_stride,  SIZE);
          Flatten(u_ptr + (x >> 1), values[1], uv_stride, SIZE2);
          Flatten(v_ptr + (x >> 1), values[2], uv_stride, SIZE2);
        } else {
          need_reset = 1;
        }
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, SIZE);
      }
      a_ptr += SIZE * a_stride;
      y_ptr += SIZE * y_stride;
      u_ptr += SIZE2 * uv_stride;
      v_ptr += SIZE2 * uv_stride;
    }
    if (y < height) {
      const int sub_height = height - y;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      SIZE, sub_height);
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, sub_height);
      }
    }
  }
}